

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  fVar1 = (pIVar4->DC).CursorPosPrevLine.y;
  fVar2 = (pIVar4->Pos).y;
  fVar6 = (center_y_ratio + -0.5) * (pIVar5->Style).ItemSpacing.y;
  fVar3 = (pIVar4->DC).PrevLineSize.y;
  pIVar4->WriteAccessed = true;
  (pIVar4->ScrollTarget).y =
       (float)(int)(fVar3 * center_y_ratio + fVar6 + fVar6 + (fVar1 - fVar2) + (pIVar4->Scroll).y);
  (pIVar4->ScrollTargetCenterRatio).y = center_y_ratio;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }